

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O3

err_t bignOidToDER(octet *der,size_t *count,char *oid)

{
  bool_t bVar1;
  size_t sVar2;
  
  bVar1 = strIsValid(oid);
  if (bVar1 == 0) {
    return 0x6d;
  }
  bVar1 = memIsValid(count,8);
  if (bVar1 == 0) {
    return 0x6d;
  }
  if (der == (octet *)0x0) {
    sVar2 = oidToDER((octet *)0x0,oid);
    if (sVar2 == 0xffffffffffffffff) {
      return 0x12d;
    }
  }
  else {
    bVar1 = memIsValid(der,*count);
    if (bVar1 == 0) {
      return 0x6d;
    }
    sVar2 = oidToDER((octet *)0x0,oid);
    if (sVar2 == 0xffffffffffffffff) {
      return 0x12d;
    }
    if (*count < sVar2) {
      return 0x6e;
    }
    sVar2 = oidToDER(der,oid);
  }
  *count = sVar2;
  return 0;
}

Assistant:

err_t bignOidToDER(octet der[], size_t* count, const char* oid)
{
	size_t len;
	if (!strIsValid(oid) || 
		!memIsValid(count, O_PER_S) ||
		!memIsNullOrValid(der, *count))
		return ERR_BAD_INPUT;
	len = oidToDER(0, oid);
	if (len == SIZE_MAX)
		return ERR_BAD_OID;
	if (der)
	{
		if (*count < len)
			return ERR_OUTOFMEMORY;
		len = oidToDER(der, oid);
		ASSERT(len != SIZE_MAX);
	}
	*count = len;
	return ERR_OK;
}